

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiReleasePropertyStore(aiPropertyStore *p)

{
  if (p != (aiPropertyStore *)0x0) {
    Assimp::BatchLoader::PropertyMap::~PropertyMap((PropertyMap *)p);
  }
  operator_delete(p,0xc0);
  return;
}

Assistant:

ASSIMP_API void aiReleasePropertyStore(aiPropertyStore* p)
{
    delete reinterpret_cast<PropertyMap*>(p);
}